

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char *s,format_specs *specs,locale_ref param_4)

{
  basic_string_view<char> s_00;
  presentation_type pVar1;
  basic_appender<char> bVar2;
  format_specs *in_RCX;
  basic_appender<char> in_RDX;
  char *in_RSI;
  char *in_RDI;
  locale_ref in_stack_ffffffffffffffb0;
  format_specs *in_stack_ffffffffffffffb8;
  locale_ref in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffd0;
  char *local_20;
  basic_appender<char> in_stack_fffffffffffffff8;
  
  local_20 = in_RSI;
  pVar1 = basic_specs::type((basic_specs *)in_RDX.container);
  if (pVar1 == dec) {
    bit_cast<unsigned_long,_const_char_*,_0>(&local_20);
    bVar2 = write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
                      (in_stack_fffffffffffffff8,(unsigned_long)in_RDI,in_RCX);
  }
  else {
    if (local_20 == (char *)0x0) {
      report_error((char *)in_stack_ffffffffffffffc0.locale_);
    }
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_stack_ffffffffffffffb8,
               (char *)in_stack_ffffffffffffffb0.locale_);
    locale_ref::locale_ref((locale_ref *)&stack0xffffffffffffffb0);
    s_00.size_ = in_stack_ffffffffffffffd0;
    s_00.data_ = in_RDI;
    bVar2 = write<char,fmt::v11::basic_appender<char>>
                      (in_RDX,s_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  }
  return (basic_appender<char>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s, const format_specs& specs,
                         locale_ref) -> OutputIt {
  if (specs.type() == presentation_type::pointer)
    return write_ptr<Char>(out, bit_cast<uintptr_t>(s), &specs);
  if (!s) report_error("string pointer is null");
  return write<Char>(out, basic_string_view<Char>(s), specs, {});
}